

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvErrHandler(int error_code,char *module,char *function,char *msg,void *data)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_R8;
  char err_type [10];
  CVodeMem cv_mem;
  char local_3a [10];
  long local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_30 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_EDI == 99) {
    sprintf(local_3a,"WARNING");
  }
  else {
    sprintf(local_3a,"ERROR");
  }
  if (*(long *)(local_30 + 0x480) != 0) {
    fprintf(*(FILE **)(local_30 + 0x480),"\n[%s %s]  %s\n",local_10,local_3a,local_18);
    fprintf(*(FILE **)(local_30 + 0x480),"  %s\n\n",local_20);
  }
  return;
}

Assistant:

void cvErrHandler(int error_code, const char *module,
                  const char *function, char *msg, void *data)
{
  CVodeMem cv_mem;
  char err_type[10];

  /* data points to cv_mem here */

  cv_mem = (CVodeMem) data;

  if (error_code == CV_WARNING)
    sprintf(err_type,"WARNING");
  else
    sprintf(err_type,"ERROR");

#ifndef NO_FPRINTF_OUTPUT
  if (cv_mem->cv_errfp!=NULL) {
    fprintf(cv_mem->cv_errfp,"\n[%s %s]  %s\n",module,err_type,function);
    fprintf(cv_mem->cv_errfp,"  %s\n\n",msg);
  }
#endif

  return;
}